

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O1

void __thiscall
OptionParser::parseReportOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  OptionParser *pOVar1;
  string *s;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  InputError *this_00;
  OptionParser *this_01;
  IndexOption option;
  int iVar5;
  string local_b8;
  undefined1 local_98 [8];
  string keyword;
  string local_70;
  undefined1 local_50 [32];
  
  s = (tokenList->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)((ulong)((long)(tokenList->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)s) >> 5);
  if (iVar5 < 2) {
    return;
  }
  Utilities::upperCase((string *)local_98,s);
  pOVar1 = (OptionParser *)(local_50 + 0x10);
  local_50._0_8_ = pOVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"PAGESIZE","");
  bVar3 = Utilities::match((string *)local_98,(string *)local_50);
  if ((OptionParser *)local_50._0_8_ != pOVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (!bVar3) {
    local_50._0_8_ = pOVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"FILE","");
    bVar3 = Utilities::match((string *)local_98,(string *)local_50);
    if ((OptionParser *)local_50._0_8_ != pOVar1) {
      operator_delete((void *)local_50._0_8_);
    }
    if (bVar3) {
      Options::setOption(&network->options,RPT_FILE_NAME,s + 1);
    }
    else {
      iVar4 = Utilities::findFullMatch((string *)local_98,reportOptionKeywords);
      if (iVar4 < 0) {
        local_50._0_8_ = pOVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"NODES","");
        bVar3 = Utilities::match((string *)local_98,(string *)local_50);
        this_01 = (OptionParser *)local_50._0_8_;
        if ((OptionParser *)local_50._0_8_ != pOVar1) {
          operator_delete((void *)local_50._0_8_);
        }
        iVar4 = 0;
        if (!bVar3) {
          local_50._0_8_ = pOVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"LINKS","");
          bVar3 = Utilities::match((string *)local_98,(string *)local_50);
          this_01 = (OptionParser *)local_50._0_8_;
          if ((OptionParser *)local_50._0_8_ != pOVar1) {
            operator_delete((void *)local_50._0_8_);
          }
          iVar4 = 1;
          if (!bVar3) {
            parseReportField(this_01,network,iVar5,s);
            goto LAB_00137f53;
          }
        }
        parseReportItems(this_01,iVar4,network,iVar5,s);
      }
      else {
        option = iVar4 + REPORT_SUMMARY;
        if (option == REPORT_STATUS) {
          local_50._0_8_ = pOVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"FULL","");
          bVar3 = Utilities::match(s + 1,(string *)local_50);
          if ((OptionParser *)local_50._0_8_ != pOVar1) {
            operator_delete((void *)local_50._0_8_);
          }
        }
        else {
          bVar3 = false;
        }
        if (bVar3 == false) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"YES","");
          keyword.field_2._8_8_ = s + 1;
          bVar3 = Utilities::match((string *)keyword.field_2._8_8_,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          iVar5 = 1;
          if (!bVar3) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NO","");
            bVar3 = Utilities::match((string *)keyword.field_2._8_8_,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            iVar5 = 0;
            if (!bVar3) {
              this_00 = (InputError *)__cxa_allocate_exception(0x30);
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              pcVar2 = s[1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,pcVar2,pcVar2 + s[1]._M_string_length);
              InputError::InputError(this_00,3,&local_b8);
              __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
            }
          }
        }
        else {
          iVar5 = 1;
          option = REPORT_STATUS;
          Options::setOption(&network->options,REPORT_TRIALS,1);
        }
        Options::setOption(&network->options,option,iVar5);
      }
    }
  }
LAB_00137f53:
  if (local_98 != (undefined1  [8])&keyword._M_string_length) {
    operator_delete((void *)local_98);
  }
  return;
}

Assistant:

void OptionParser::parseReportOption(Network* network, vector<string>& tokenList)
{
    // ... check for no data
    int nTokens = tokenList.size();
    if ( nTokens < 2 ) return;
    string* tokens = &tokenList[0];
    string keyword = Utilities::upperCase(tokens[0]);

    // ... PAGESIZE is deprecated
    if ( Utilities::match(keyword, "PAGESIZE") ) return;

    // ... check if option is name of report file
    if ( Utilities::match(keyword, "FILE") )
    {
        network->options.setOption(Options::RPT_FILE_NAME, tokens[1]);
        return;
    }

    // ... check for report types options
    int value;
    int option = Utilities::findFullMatch(keyword, reportOptionKeywords);
    if ( option >= 0 )
    {
        option = Options::REPORT_SUMMARY + option;

        // ... convert EPANET 2 "STATUS FULL" option to "TRIALS  YES" option
        if ( option == Options::REPORT_STATUS && Utilities::match(tokens[1], "FULL") )
        {
            network->options.setOption(Options::REPORT_TRIALS, true);
            network->options.setOption(Options::REPORT_STATUS, true);
            return;
        }

        if ( Utilities::match(tokens[1], "YES") ) value = true;
        else if ( Utilities::match(tokens[1], "NO") ) value = false;
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
        network->options.setOption((Options::IndexOption)option, value);
        return;
    }

    // ... parse which nodes & links are reported on
    if ( Utilities::match(keyword, "NODES") )
    {
        parseReportItems(Element::NODE, network, nTokens, tokens);
    }
    else if ( Utilities::match(keyword, "LINKS") )
    {
        parseReportItems(Element::LINK, network, nTokens, tokens);
    }

    // ... parse report field options
    else parseReportField(network, nTokens, tokens);
}